

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  u32 *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  u32 uVar6;
  u32 uVar7;
  u32 uVar8;
  u8 *p;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint nativeCksum;
  int iVar12;
  int n;
  u32 local_e0;
  long local_d0;
  undefined4 local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  undefined8 local_a8;
  uint local_a0;
  uint local_9c;
  u32 *page0;
  i64 nSize;
  undefined8 local_88;
  undefined8 uStack_80;
  u8 *local_70;
  u8 *local_68;
  u8 *local_60;
  u8 *local_58;
  long *local_50;
  u32 *local_48;
  ulong local_40;
  u32 *local_38;
  
  iVar3 = walIndexPage(pWal,0,&page0);
  if (iVar3 != 0) {
    return iVar3;
  }
  if ((page0 != (u32 *)0x0) && (iVar3 = walIndexTryHdr(pWal,pChanged), iVar3 == 0)) {
    iVar3 = 0;
    goto LAB_001273ea;
  }
  if ((pWal->readOnly & 2) != 0) {
    iVar3 = walLockShared(pWal,0);
    if (iVar3 != 0) {
      return iVar3;
    }
    walUnlockShared(pWal,0);
    return 0x108;
  }
  iVar3 = walLockExclusive(pWal,0,1);
  if (iVar3 != 0) {
    return iVar3;
  }
  pWal->writeLock = '\x01';
  iVar3 = 0;
  iVar4 = walIndexPage(pWal,0,&page0);
  if (iVar4 == 0) {
    iVar4 = walIndexTryHdr(pWal,pChanged);
    if (iVar4 == 0) {
      bVar2 = true;
    }
    else {
      n = 7 - (uint)pWal->ckptLock;
      iVar4 = pWal->ckptLock + 1;
      iVar3 = walLockExclusive(pWal,iVar4,n);
      if (iVar3 == 0) {
        (pWal->hdr).aSalt[0] = 0;
        (pWal->hdr).aSalt[1] = 0;
        (pWal->hdr).aCksum[0] = 0;
        (pWal->hdr).aCksum[1] = 0;
        (pWal->hdr).mxFrame = 0;
        (pWal->hdr).nPage = 0;
        (pWal->hdr).aFrameCksum[0] = 0;
        (pWal->hdr).aFrameCksum[1] = 0;
        local_88 = 0;
        uStack_80 = 0;
        (pWal->hdr).iVersion = 0;
        (pWal->hdr).unused = 0;
        (pWal->hdr).iChange = 0;
        (pWal->hdr).isInit = '\0';
        (pWal->hdr).bigEndCksum = '\0';
        (pWal->hdr).szPage = 0;
        iVar3 = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&nSize);
        if (iVar3 == 0) {
          if (0x20 < nSize) {
            iVar3 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,&local_b8,0x20,0);
            if (iVar3 != 0) goto LAB_001273ba;
            if ((local_b8._3_1_ & 0xfffffffe |
                (local_b8 >> 0x10 & 0xff) << 8 | (local_b8 >> 8 & 0xff) << 0x10 | local_b8 << 0x18)
                == 0x377f0682) {
              uVar9 = (local_b0 >> 8 & 0xff) << 0x10 | local_b0 << 0x18;
              uVar5 = (local_b0 >> 0x10 & 0xff) << 8;
              uVar11 = local_b0 >> 0x18 | uVar9 | uVar5;
              if (0xffff01fe < uVar11 - 0x10001 && (uVar11 & uVar11 - 1) == 0) {
                (pWal->hdr).bigEndCksum = (u8)(local_b8._3_1_ & 1);
                pWal->szPage = uVar11;
                pWal->nCkpt = local_ac >> 0x18 | (local_ac & 0xff0000) >> 8 |
                              (local_ac & 0xff00) << 8 | local_ac << 0x18;
                *(undefined8 *)(pWal->hdr).aSalt = local_a8;
                local_38 = (pWal->hdr).aFrameCksum;
                walChecksumBytes(local_b8._3_1_ & 1 ^ 1,(u8 *)&local_b8,0x18,(u32 *)0x0,local_38);
                if (((pWal->hdr).aFrameCksum[0] ==
                     (local_a0 >> 0x18 | (local_a0 & 0xff0000) >> 8 | (local_a0 & 0xff00) << 8 |
                     local_a0 << 0x18)) &&
                   ((pWal->hdr).aFrameCksum[1] ==
                    (local_9c >> 0x18 | (local_9c & 0xff0000) >> 8 | (local_9c & 0xff00) << 8 |
                    local_9c << 0x18))) {
                  if ((local_b4 >> 0x18 | (local_b4 & 0xff0000) >> 8 | (local_b4 & 0xff00) << 8 |
                      local_b4 << 0x18) == 0x2de218) {
                    uVar11 = uVar11 + 0x18;
                    p = (u8 *)sqlite3_malloc(uVar11);
                    iVar3 = 7;
                    if (p != (u8 *)0x0) {
                      local_48 = (pWal->hdr).aSalt;
                      local_58 = p + 0x18;
                      local_50 = (long *)(p + 8);
                      local_70 = p + 4;
                      local_60 = p + 0x10;
                      local_68 = p + 0x14;
                      local_88 = 0;
                      local_d0 = 0x20;
                      local_e0 = 0;
                      local_40 = (ulong)uVar11;
                      do {
                        uStack_80 = 0;
                        lVar10 = local_d0;
                        do {
                          local_d0 = local_40 + lVar10;
                          iVar12 = 0;
                          iVar3 = iVar12;
                          if ((((nSize < local_d0) ||
                               (iVar3 = (*pWal->pWalFd->pMethods->xRead)
                                                  (pWal->pWalFd,p,uVar11,lVar10), iVar3 != 0)) ||
                              (iVar3 = iVar12, *(long *)local_48 != *local_50)) ||
                             (uVar6 = sqlite3Get4byte(p), puVar1 = local_38, uVar6 == 0)) {
LAB_00127346:
                            sqlite3_free(p);
                            if (iVar3 == 0) goto LAB_00127355;
                            goto LAB_001273ba;
                          }
                          nativeCksum = (uint)((pWal->hdr).bigEndCksum == '\0');
                          walChecksumBytes(nativeCksum,p,8,local_38,local_38);
                          walChecksumBytes(nativeCksum,local_58,pWal->szPage,puVar1,puVar1);
                          uVar8 = (pWal->hdr).aFrameCksum[0];
                          uVar7 = sqlite3Get4byte(local_60);
                          iVar3 = 0;
                          if ((uVar8 != uVar7) ||
                             (uVar8 = (pWal->hdr).aFrameCksum[1], uVar7 = sqlite3Get4byte(local_68),
                             uVar8 != uVar7)) goto LAB_00127346;
                          local_e0 = local_e0 + 1;
                          uVar8 = sqlite3Get4byte(local_70);
                          iVar3 = walIndexAppend(pWal,local_e0,uVar6);
                          if (iVar3 != 0) goto LAB_00127346;
                          lVar10 = local_d0;
                        } while (uVar8 == 0);
                        (pWal->hdr).mxFrame = local_e0;
                        (pWal->hdr).nPage = uVar8;
                        (pWal->hdr).szPage = (ushort)(uVar9 >> 0x10) | (ushort)uVar5;
                        local_88 = *(undefined8 *)(pWal->hdr).aFrameCksum;
                      } while( true );
                    }
                  }
                  else {
                    sqlite3CantopenError(0xb62f);
                    iVar3 = 0xe;
                  }
                  goto LAB_001273ba;
                }
              }
            }
          }
LAB_00127355:
          *(undefined8 *)(pWal->hdr).aFrameCksum = local_88;
          walIndexWriteHdr(pWal);
          puVar1 = *pWal->apWiData;
          puVar1[0x18] = 0;
          puVar1[0x19] = 0;
          for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
            puVar1[lVar10 + 0x1a] = 0xffffffff;
          }
          uVar6 = (pWal->hdr).mxFrame;
          if (uVar6 != 0) {
            puVar1[0x1a] = uVar6;
          }
          if ((pWal->hdr).nPage == 0) {
            iVar3 = 0;
          }
          else {
            iVar3 = 0;
            sqlite3_log(0x11b,"recovered %d frames from WAL file %s",(ulong)(pWal->hdr).mxFrame,
                        pWal->zWalName);
          }
        }
LAB_001273ba:
        walUnlockExclusive(pWal,iVar4,n);
      }
      *pChanged = 1;
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
    iVar3 = iVar4;
  }
  pWal->writeLock = '\0';
  walUnlockExclusive(pWal,0,1);
  if (!bVar2) {
    return iVar3;
  }
LAB_001273ea:
  if ((pWal->hdr).iVersion != 0x2de218) {
    iVar3 = 0xe;
    sqlite3CantopenError(0xb996);
  }
  return iVar3;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the 
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    return rc;
  };
  assert( page0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently 
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  assert( badHdr==0 || pWal->writeLock==0 );
  if( badHdr ){
    if( pWal->readOnly & WAL_SHM_RDONLY ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else if( SQLITE_OK==(rc = walLockExclusive(pWal, WAL_WRITE_LOCK, 1)) ){
      pWal->writeLock = 1;
      if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
        badHdr = walIndexTryHdr(pWal, pChanged);
        if( badHdr ){
          /* If the wal-index header is still malformed even while holding
          ** a WRITE lock, it can only mean that the header is corrupted and
          ** needs to be reconstructed.  So run recovery to do exactly that.
          */
          rc = walIndexRecover(pWal);
          *pChanged = 1;
        }
      }
      pWal->writeLock = 0;
      walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }

  return rc;
}